

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

void If_CluChangePhase(word *pF,int nVars,int iVar)

{
  word wVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  int local_38;
  int Step;
  int k;
  int i_1;
  word Temp;
  int local_20;
  int Shift;
  int i;
  int nWords;
  int iVar_local;
  int nVars_local;
  word *pF_local;
  
  iVar2 = If_CluWordNum(nVars);
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDec16.c"
                  ,0x1ba,"void If_CluChangePhase(word *, int, int)");
  }
  if (iVar < 6) {
    for (local_20 = 0; local_20 < iVar2; local_20 = local_20 + 1) {
      bVar4 = (byte)(1 << ((byte)iVar & 0x1f));
      pF[local_20] = (pF[local_20] & (Truth6[iVar] ^ 0xffffffffffffffff)) << (bVar4 & 0x3f) |
                     (pF[local_20] & Truth6[iVar]) >> (bVar4 & 0x3f);
    }
  }
  else {
    iVar3 = 1 << ((byte)iVar - 6 & 0x1f);
    _iVar_local = pF;
    for (local_38 = 0; local_38 < iVar2; local_38 = iVar3 * 2 + local_38) {
      for (Step = 0; Step < iVar3; Step = Step + 1) {
        wVar1 = _iVar_local[Step];
        _iVar_local[Step] = _iVar_local[iVar3 + Step];
        _iVar_local[iVar3 + Step] = wVar1;
      }
      _iVar_local = _iVar_local + (iVar3 << 1);
    }
  }
  return;
}

Assistant:

void If_CluChangePhase( word * pF, int nVars, int iVar )
{
    int nWords = If_CluWordNum( nVars );
    assert( iVar < nVars );
    if ( iVar < 6 )
    {
        int i, Shift = (1 << iVar);
        for ( i = 0; i < nWords; i++ )
            pF[i] = ((pF[i] & ~Truth6[iVar]) << Shift) | ((pF[i] & Truth6[iVar]) >> Shift);
    }
    else
    {
        word Temp;
        int i, k, Step = (1 << (iVar - 6));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
            {
                Temp = pF[i];
                pF[i] = pF[Step+i];
                pF[Step+i] = Temp;
            }
            pF += 2*Step;
        }
    }
}